

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O0

XSSimpleTypeDefinition * __thiscall
xercesc_4_0::XSObjectFactory::addOrFind
          (XSObjectFactory *this,DatatypeValidator *validator,XSModel *xsModel,bool isAnySimpleType)

{
  ValidatorType VVar1;
  DatatypeValidator *validator_00;
  BaseRefVectorOf<xercesc_4_0::DatatypeValidator> *this_00;
  XMLSize_t maxElems;
  DatatypeValidator *validator_01;
  XSSimpleTypeDefinition *toAdd;
  XSAnnotation *headAnnot;
  bool bVar2;
  ulong local_90;
  XMLSize_t i;
  XMLSize_t size;
  RefVectorOf<xercesc_4_0::DatatypeValidator> *membersDV;
  DatatypeValidator *baseDV;
  ValidatorType dvType;
  bool primitiveTypeSelf;
  XSSimpleTypeDefinition *pXStack_50;
  VARIETY typeVariety;
  XSSimpleTypeDefinition *primitiveOrItemType;
  XSSimpleTypeDefinitionList *memberTypes;
  XSTypeDefinition *baseType;
  XSSimpleTypeDefinition *xsObj;
  bool isAnySimpleType_local;
  XSModel *xsModel_local;
  DatatypeValidator *validator_local;
  XSObjectFactory *this_local;
  
  baseType = (XSTypeDefinition *)XSModel::getXSObject(xsModel,validator);
  if (baseType == (XSTypeDefinition *)0x0) {
    primitiveOrItemType = (XSSimpleTypeDefinition *)0x0;
    pXStack_50 = (XSSimpleTypeDefinition *)0x0;
    dvType = AnyURI;
    bVar2 = false;
    VVar1 = DatatypeValidator::getType(validator);
    validator_00 = DatatypeValidator::getBaseValidator(validator);
    if (VVar1 == Union) {
      dvType = Name;
      this_00 = &UnionDatatypeValidator::getMemberTypeValidators
                           ((UnionDatatypeValidator *)validator)->
                 super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>;
      maxElems = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::size(this_00);
      if (maxElems != 0) {
        primitiveOrItemType =
             (XSSimpleTypeDefinition *)XMemory::operator_new(0x30,this->fMemoryManager);
        RefVectorOf<xercesc_4_0::XSSimpleTypeDefinition>::RefVectorOf
                  ((RefVectorOf<xercesc_4_0::XSSimpleTypeDefinition> *)primitiveOrItemType,maxElems,
                   false,this->fMemoryManager);
        for (local_90 = 0; local_90 < maxElems; local_90 = local_90 + 1) {
          validator_01 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt
                                   (this_00,local_90);
          toAdd = addOrFind(this,validator_01,xsModel,false);
          BaseRefVectorOf<xercesc_4_0::XSSimpleTypeDefinition>::addElement
                    ((BaseRefVectorOf<xercesc_4_0::XSSimpleTypeDefinition> *)primitiveOrItemType,
                     toAdd);
        }
      }
      if (validator_00 == (DatatypeValidator *)0x0) {
        memberTypes = (XSSimpleTypeDefinitionList *)
                      XSModel::getTypeDefinition
                                (xsModel,(XMLCh *)SchemaSymbols::fgDT_ANYSIMPLETYPE,
                                 (XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
      }
      else {
        memberTypes = (XSSimpleTypeDefinitionList *)addOrFind(this,validator_00,xsModel,false);
      }
    }
    else if (VVar1 == List) {
      dvType = QName;
      VVar1 = DatatypeValidator::getType(validator_00);
      if (VVar1 == List) {
        memberTypes = (XSSimpleTypeDefinitionList *)addOrFind(this,validator_00,xsModel,false);
        pXStack_50 = XSSimpleTypeDefinition::getItemType((XSSimpleTypeDefinition *)memberTypes);
      }
      else {
        memberTypes = (XSSimpleTypeDefinitionList *)
                      XSModel::getTypeDefinition
                                (xsModel,(XMLCh *)SchemaSymbols::fgDT_ANYSIMPLETYPE,
                                 (XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
        pXStack_50 = addOrFind(this,validator_00,xsModel,false);
      }
    }
    else if (isAnySimpleType) {
      memberTypes = (XSSimpleTypeDefinitionList *)
                    XSModel::getTypeDefinition
                              (xsModel,(XMLCh *)SchemaSymbols::fgATTVAL_ANYTYPE,
                               (XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    }
    else {
      bVar2 = validator_00 == (DatatypeValidator *)0x0;
      if (bVar2) {
        memberTypes = (XSSimpleTypeDefinitionList *)
                      XSModel::getTypeDefinition
                                (xsModel,(XMLCh *)SchemaSymbols::fgDT_ANYSIMPLETYPE,
                                 (XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
      }
      else {
        memberTypes = (XSSimpleTypeDefinitionList *)addOrFind(this,validator_00,xsModel,false);
        pXStack_50 = XSSimpleTypeDefinition::getPrimitiveType((XSSimpleTypeDefinition *)memberTypes)
        ;
      }
    }
    baseType = (XSTypeDefinition *)XMemory::operator_new(0x80,this->fMemoryManager);
    headAnnot = getAnnotationFromModel(this,xsModel,validator);
    XSSimpleTypeDefinition::XSSimpleTypeDefinition
              ((XSSimpleTypeDefinition *)baseType,validator,dvType,(XSTypeDefinition *)memberTypes,
               pXStack_50,(XSSimpleTypeDefinitionList *)primitiveOrItemType,headAnnot,xsModel,
               this->fMemoryManager);
    putObjectInMap(this,validator,(XSObject *)baseType);
    if (bVar2) {
      XSSimpleTypeDefinition::setPrimitiveType
                ((XSSimpleTypeDefinition *)baseType,(XSSimpleTypeDefinition *)baseType);
    }
    processFacets(this,validator,xsModel,(XSSimpleTypeDefinition *)baseType);
  }
  return (XSSimpleTypeDefinition *)baseType;
}

Assistant:

XSSimpleTypeDefinition*
XSObjectFactory::addOrFind(DatatypeValidator* const validator,
                           XSModel* const xsModel,
                           bool isAnySimpleType)
{
    XSSimpleTypeDefinition* xsObj = (XSSimpleTypeDefinition*) xsModel->getXSObject(validator);
    if (!xsObj)
    {
        XSTypeDefinition* baseType = 0;
        XSSimpleTypeDefinitionList* memberTypes = 0;
        XSSimpleTypeDefinition* primitiveOrItemType = 0;
        XSSimpleTypeDefinition::VARIETY typeVariety = XSSimpleTypeDefinition::VARIETY_ATOMIC;
        bool primitiveTypeSelf = false;

        //REVISIT: the getFixed method is protected so added friend XSObjectFactory
        //         to DatatypeValidator class...
        DatatypeValidator::ValidatorType dvType = validator->getType();
        DatatypeValidator* baseDV = validator->getBaseValidator();

        if (dvType == DatatypeValidator::Union)
        {
            typeVariety = XSSimpleTypeDefinition::VARIETY_UNION;
            RefVectorOf<DatatypeValidator>* membersDV = ((UnionDatatypeValidator*)validator)->getMemberTypeValidators();
            XMLSize_t size = membersDV->size();
            if (size)
            {
                memberTypes = new (fMemoryManager) RefVectorOf<XSSimpleTypeDefinition>(size, false, fMemoryManager);
                for (XMLSize_t i=0; i<size; i++)
                    memberTypes->addElement(addOrFind(membersDV->elementAt(i), xsModel));
            }

            if (baseDV)
            {
                baseType = addOrFind(baseDV, xsModel);
            }
            else
            {
                baseType = (XSSimpleTypeDefinition*) xsModel->getTypeDefinition
                (
                    SchemaSymbols::fgDT_ANYSIMPLETYPE
                    , SchemaSymbols::fgURI_SCHEMAFORSCHEMA
                );
            }
        }
        else if (dvType == DatatypeValidator::List)
        {
            typeVariety = XSSimpleTypeDefinition::VARIETY_LIST;
            if (baseDV->getType() == DatatypeValidator::List)
            {
                baseType = addOrFind(baseDV, xsModel);
                primitiveOrItemType = ((XSSimpleTypeDefinition*) baseType)->getItemType();
            }
            else
            {
                baseType = (XSSimpleTypeDefinition*) xsModel->getTypeDefinition
                (
                    SchemaSymbols::fgDT_ANYSIMPLETYPE
                    , SchemaSymbols::fgURI_SCHEMAFORSCHEMA
                );
                primitiveOrItemType = addOrFind(baseDV, xsModel);
            }
        }
        else if (!isAnySimpleType)
        {
            if (baseDV)
            {
                baseType = addOrFind(baseDV, xsModel);
                primitiveOrItemType = ((XSSimpleTypeDefinition*) baseType)->getPrimitiveType();
            }
            else // built-in
            {
                baseType = (XSSimpleTypeDefinition*) xsModel->getTypeDefinition
                (
                    SchemaSymbols::fgDT_ANYSIMPLETYPE
                    , SchemaSymbols::fgURI_SCHEMAFORSCHEMA
                );
                primitiveTypeSelf = true;
            }
        }
        else
        {
            baseType = xsModel->getTypeDefinition(SchemaSymbols::fgATTVAL_ANYTYPE, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
        }

        xsObj = new (fMemoryManager) XSSimpleTypeDefinition
        (
            validator
            , typeVariety
            , baseType
            , primitiveOrItemType
            , memberTypes
            , getAnnotationFromModel(xsModel, validator)
            , xsModel
            , fMemoryManager
        );
        putObjectInMap(validator, xsObj);

        if (primitiveTypeSelf)
            xsObj->setPrimitiveType(xsObj);

        // process facets
        processFacets(validator, xsModel, xsObj);
    }

    return xsObj;
}